

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer_read_int(void *i,chck_bits bits,chck_buffer *buf)

{
  _Bool _Var1;
  size_t sVar2;
  chck_buffer *buf_local;
  chck_bits bits_local;
  void *i_local;
  
  if ((i != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    _Var1 = valid_bits(bits);
    if (_Var1) {
      sVar2 = chck_buffer_read(i,(ulong)bits,1,buf);
      if (sVar2 == 1) {
        _Var1 = chck_buffer_native_endianess(buf);
        if (!_Var1) {
          chck_bswap_single(i,(ulong)bits);
        }
        i_local._7_1_ = true;
      }
      else {
        i_local._7_1_ = false;
      }
    }
    else {
      i_local._7_1_ = false;
    }
    return i_local._7_1_;
  }
  __assert_fail("i && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x120,"_Bool chck_buffer_read_int(void *, enum chck_bits, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_int(void *i, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(i && buf);

   if (!valid_bits(bits))
      return false;

   if (unlikely(chck_buffer_read(i, bits, 1, buf) != 1))
      return false;

   if (!chck_buffer_native_endianess(buf))
      chck_bswap_single(i, bits);

   return true;
}